

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

void Unr_ManProfileRanks(Vec_Int_t *vRanks)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  int *__ptr;
  void *__s;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  uint uVar10;
  
  uVar10 = vRanks->nSize;
  if ((ulong)uVar10 == 0) {
    __ptr = (int *)malloc(0x10);
    iVar6 = 1;
LAB_005be2b9:
    piVar9 = __ptr + 1;
    *__ptr = 0x10;
    iVar7 = 0x10;
  }
  else {
    uVar8 = *vRanks->pArray;
    if (1 < (int)uVar10) {
      uVar4 = 1;
      do {
        uVar2 = vRanks->pArray[uVar4];
        if ((int)uVar8 <= (int)uVar2) {
          uVar8 = uVar2;
        }
        uVar4 = uVar4 + 1;
      } while (uVar10 != uVar4);
    }
    iVar7 = uVar8 + 1;
    __ptr = (int *)malloc(0x10);
    iVar6 = iVar7;
    if (uVar8 < 0xf) goto LAB_005be2b9;
    piVar9 = __ptr + 1;
    *__ptr = iVar7;
    if (iVar7 == 0) {
      __ptr[2] = 0;
      __ptr[3] = 0;
      __ptr[1] = 0;
      iVar6 = 0;
      goto LAB_005be2f5;
    }
  }
  __s = malloc((long)iVar7 << 2);
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = iVar6;
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar6 << 2);
  }
LAB_005be2f5:
  if (0 < (int)uVar10) {
    piVar3 = vRanks->pArray;
    lVar5 = 0;
    do {
      iVar6 = piVar3[lVar5];
      if (((long)iVar6 < 0) || (*piVar9 <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)(*(long *)(__ptr + 2) + (long)iVar6 * 4);
      *piVar1 = *piVar1 + 1;
      lVar5 = lVar5 + 1;
      uVar10 = vRanks->nSize;
    } while (lVar5 < (int)uVar10);
    iVar6 = *piVar9;
  }
  if (iVar6 < 1) {
    uVar8 = 0;
  }
  else {
    uVar4 = 0;
    uVar8 = 0;
    do {
      uVar10 = *(uint *)(*(long *)(__ptr + 2) + uVar4 * 4);
      if (uVar10 != 0) {
        printf("%2d : %8d  (%6.2f %%)\n",((double)(int)uVar10 * 100.0) / (double)vRanks->nSize,
               uVar4 & 0xffffffff,(ulong)uVar10);
        uVar8 = uVar8 + uVar10 * (int)uVar4;
        iVar6 = *piVar9;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)iVar6);
    uVar10 = vRanks->nSize;
  }
  printf("Extra space = %d (%6.2f %%)  ",((double)(int)uVar8 * 100.0) / (double)(int)uVar10,
         (ulong)uVar8);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Unr_ManProfileRanks( Vec_Int_t * vRanks )
{
    int RankMax = Vec_IntFindMax( vRanks );
    Vec_Int_t * vCounts = Vec_IntStart( RankMax+1 );
    int i, Rank, Count, nExtras = 0;
    Vec_IntForEachEntry( vRanks, Rank, i )
        Vec_IntAddToEntry( vCounts, Rank, 1 );
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 )
            continue;
        printf( "%2d : %8d  (%6.2f %%)\n", i, Count, 100.0 * Count / Vec_IntSize(vRanks) );
        nExtras += Count * i;
    }
    printf( "Extra space = %d (%6.2f %%)  ", nExtras, 100.0 * nExtras / Vec_IntSize(vRanks) );
    Vec_IntFree( vCounts );
}